

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_stream_parser.cc
# Opt level: O3

TokenType __thiscall
google::protobuf::util::converter::JsonStreamParser::GetNextTokenType(JsonStreamParser *this)

{
  converter cVar1;
  char *pcVar2;
  converter *this_00;
  bool bVar3;
  int iVar4;
  TokenType TVar5;
  size_t extraout_RDX;
  size_t sVar6;
  long lVar7;
  StringPiece input;
  
  SkipWhitespace(this);
  pcVar2 = (char *)(this->p_).length_;
  iVar4 = (int)pcVar2;
  if (iVar4 == 0) {
    TVar5 = UNKNOWN;
  }
  else {
    lVar7 = (long)iVar4;
    if (lVar7 < 0) {
      __assert_fail("len >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/stubs/stringpiece.h"
                    ,0xe6,
                    "google::protobuf::StringPiece::StringPiece(const char *, stringpiece_ssize_type)"
                   );
    }
    this_00 = (converter *)(this->p_).ptr_;
    cVar1 = *this_00;
    TVar5 = BEGIN_STRING;
    if ((cVar1 != (converter)0x22) && (TVar5 = BEGIN_STRING, cVar1 != (converter)0x27)) {
      if ((cVar1 == (converter)0x2d) || ((byte)((char)cVar1 - 0x30U) < 10)) {
        TVar5 = BEGIN_NUMBER;
      }
      else {
        if (((long)DAT_003c7fe0 <= lVar7) &&
           (iVar4 = bcmp(this_00,kKeywordTrue,DAT_003c7fe0), iVar4 == 0)) {
          return BEGIN_TRUE;
        }
        if (((long)DAT_003c7ff0 <= lVar7) &&
           (iVar4 = bcmp(this_00,kKeywordFalse,DAT_003c7ff0), iVar4 == 0)) {
          return BEGIN_FALSE;
        }
        sVar6 = DAT_003c8000;
        if (((long)DAT_003c8000 <= lVar7) &&
           (iVar4 = bcmp(this_00,kKeywordNull,DAT_003c8000), sVar6 = extraout_RDX, iVar4 == 0)) {
          return BEGIN_NULL;
        }
        if ((byte)cVar1 < 0x5d) {
          if (cVar1 == (converter)0x2c) {
            return VALUE_SEPARATOR;
          }
          if (cVar1 == (converter)0x3a) {
            return ENTRY_SEPARATOR;
          }
          if (cVar1 == (converter)0x5b) {
            return BEGIN_ARRAY;
          }
        }
        else {
          if (cVar1 == (converter)0x5d) {
            return END_ARRAY;
          }
          if (cVar1 == (converter)0x7b) {
            return BEGIN_OBJECT;
          }
          if (cVar1 == (converter)0x7d) {
            return END_OBJECT;
          }
        }
        input.length_ = sVar6;
        input.ptr_ = pcVar2;
        bVar3 = MatchKey(this_00,input);
        TVar5 = UNKNOWN - bVar3;
      }
    }
  }
  return TVar5;
}

Assistant:

JsonStreamParser::TokenType JsonStreamParser::GetNextTokenType() {
  SkipWhitespace();

  int size = p_.size();
  if (size == 0) {
    // If we ran out of data, report unknown and we'll place the previous parse
    // type onto the stack and try again when we have more data.
    return UNKNOWN;
  }
  // TODO(sven): Split this method based on context since different contexts
  // support different tokens. Would slightly speed up processing?
  const char* data = p_.data();
  StringPiece data_view = StringPiece(data, size);
  if (*data == '\"' || *data == '\'') return BEGIN_STRING;
  if (*data == '-' || ('0' <= *data && *data <= '9')) {
    return BEGIN_NUMBER;
  }
  if (size >= kKeywordTrue.length() &&
      HasPrefixString(data_view, kKeywordTrue)) {
    return BEGIN_TRUE;
  }
  if (size >= kKeywordFalse.length() &&
      HasPrefixString(data_view, kKeywordFalse)) {
    return BEGIN_FALSE;
  }
  if (size >= kKeywordNull.length() &&
      HasPrefixString(data_view, kKeywordNull)) {
    return BEGIN_NULL;
  }
  if (*data == '{') return BEGIN_OBJECT;
  if (*data == '}') return END_OBJECT;
  if (*data == '[') return BEGIN_ARRAY;
  if (*data == ']') return END_ARRAY;
  if (*data == ':') return ENTRY_SEPARATOR;
  if (*data == ',') return VALUE_SEPARATOR;
  if (MatchKey(p_)) {
    return BEGIN_KEY;
  }

  // We don't know that we necessarily have an invalid token here, just that we
  // can't parse what we have so far. So we don't report an error and just
  // return UNKNOWN so we can try again later when we have more data, or if we
  // finish and we have leftovers.
  return UNKNOWN;
}